

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::CodeSinkingPass::FindNewBasicBlockFor(CodeSinkingPass *this,Instruction *inst)

{
  __node_base_ptr this_00;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  uint32_t end;
  IRContext *pIVar4;
  BasicBlock *this_01;
  DefUseManager *this_02;
  size_type sVar5;
  Instruction *pIVar6;
  CFG *pCVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  size_type sVar9;
  BasicBlock *local_130;
  anon_class_40_5_ad9f6e40 local_f0;
  function<void_(unsigned_int_*)> local_c8;
  uint32_t local_a8;
  bool local_a1;
  uint32_t bb_used_in;
  bool used_in_multiple_blocks;
  Instruction *merge_inst;
  uint32_t succ_bb_id;
  CodeSinkingPass *local_88;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_80;
  undefined1 local_60 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  bbs_with_uses;
  BasicBlock *bb;
  BasicBlock *original_bb;
  Instruction *inst_local;
  CodeSinkingPass *this_local;
  
  uVar2 = opt::Instruction::result_id(inst);
  if (uVar2 == 0) {
    __assert_fail("inst->result_id() != 0 && \"Instruction should have a result.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp"
                  ,0x4a,
                  "BasicBlock *spvtools::opt::CodeSinkingPass::FindNewBasicBlockFor(Instruction *)")
    ;
  }
  pIVar4 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_instr_block(pIVar4,inst);
  bbs_with_uses._M_h._M_single_bucket = (__node_base_ptr)this_01;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_60);
  this_02 = Pass::get_def_use_mgr(&this->super_Pass);
  _succ_bb_id = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_60;
  local_88 = this;
  std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::CodeSinkingPass::FindNewBasicBlockFor(spvtools::opt::Instruction*)::__0,void>
            ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_80,
             (anon_class_16_2_d768e6dc *)&succ_bb_id);
  analysis::DefUseManager::ForEachUse(this_02,inst,&local_80);
  std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_80);
  while( true ) {
    merge_inst._4_4_ = BasicBlock::id((BasicBlock *)bbs_with_uses._M_h._M_single_bucket);
    sVar5 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_60,(key_type *)((long)&merge_inst + 4));
    if (sVar5 != 0) break;
    pIVar6 = BasicBlock::terminator((BasicBlock *)bbs_with_uses._M_h._M_single_bucket);
    OVar3 = opt::Instruction::opcode(pIVar6);
    if (OVar3 == OpBranch) {
      pIVar6 = BasicBlock::terminator((BasicBlock *)bbs_with_uses._M_h._M_single_bucket);
      merge_inst._0_4_ = opt::Instruction::GetSingleWordInOperand(pIVar6,0);
      pCVar7 = Pass::cfg(&this->super_Pass);
      pvVar8 = CFG::preds(pCVar7,(uint32_t)merge_inst);
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
      if (sVar9 != 1) break;
      pIVar4 = Pass::context(&this->super_Pass);
      bbs_with_uses._M_h._M_single_bucket =
           (__node_base_ptr)IRContext::get_instr_block(pIVar4,(uint32_t)merge_inst);
    }
    else {
      _bb_used_in = BasicBlock::GetMergeInst((BasicBlock *)bbs_with_uses._M_h._M_single_bucket);
      if ((_bb_used_in == (Instruction *)0x0) ||
         (OVar3 = opt::Instruction::opcode(_bb_used_in),
         this_00 = bbs_with_uses._M_h._M_single_bucket, OVar3 != OpSelectionMerge)) break;
      local_a1 = false;
      local_a8 = 0;
      local_f0.bb = (BasicBlock *)bbs_with_uses._M_h._M_single_bucket;
      local_f0.bb_used_in = &local_a8;
      local_f0.used_in_multiple_blocks = &local_a1;
      local_f0.bbs_with_uses =
           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            *)local_60;
      local_f0.this = this;
      std::function<void(unsigned_int*)>::
      function<spvtools::opt::CodeSinkingPass::FindNewBasicBlockFor(spvtools::opt::Instruction*)::__1,void>
                ((function<void(unsigned_int*)> *)&local_c8,&local_f0);
      BasicBlock::ForEachSuccessorLabel((BasicBlock *)this_00,&local_c8);
      std::function<void_(unsigned_int_*)>::~function(&local_c8);
      if ((local_a1 & 1U) != 0) break;
      if (local_a8 == 0) {
        pIVar4 = Pass::context(&this->super_Pass);
        uVar2 = BasicBlock::MergeBlockIdIfAny((BasicBlock *)bbs_with_uses._M_h._M_single_bucket);
        bbs_with_uses._M_h._M_single_bucket =
             (__node_base_ptr)IRContext::get_instr_block(pIVar4,uVar2);
      }
      else {
        pCVar7 = Pass::cfg(&this->super_Pass);
        pvVar8 = CFG::preds(pCVar7,local_a8);
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
        if (sVar9 != 1) break;
        uVar2 = BasicBlock::MergeBlockIdIfAny((BasicBlock *)bbs_with_uses._M_h._M_single_bucket);
        end = BasicBlock::id(this_01);
        bVar1 = IntersectsPath(this,uVar2,end,
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_60);
        if (bVar1) break;
        pIVar4 = Pass::context(&this->super_Pass);
        bbs_with_uses._M_h._M_single_bucket =
             (__node_base_ptr)IRContext::get_instr_block(pIVar4,local_a8);
      }
    }
  }
  if ((BasicBlock *)bbs_with_uses._M_h._M_single_bucket == this_01) {
    local_130 = (BasicBlock *)0x0;
  }
  else {
    local_130 = (BasicBlock *)bbs_with_uses._M_h._M_single_bucket;
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_60);
  return local_130;
}

Assistant:

BasicBlock* CodeSinkingPass::FindNewBasicBlockFor(Instruction* inst) {
  assert(inst->result_id() != 0 && "Instruction should have a result.");
  BasicBlock* original_bb = context()->get_instr_block(inst);
  BasicBlock* bb = original_bb;

  std::unordered_set<uint32_t> bbs_with_uses;
  get_def_use_mgr()->ForEachUse(
      inst, [&bbs_with_uses, this](Instruction* use, uint32_t idx) {
        if (use->opcode() != spv::Op::OpPhi) {
          BasicBlock* use_bb = context()->get_instr_block(use);
          if (use_bb) {
            bbs_with_uses.insert(use_bb->id());
          }
        } else {
          bbs_with_uses.insert(use->GetSingleWordOperand(idx + 1));
        }
      });

  while (true) {
    // If |inst| is used in |bb|, then |inst| cannot be moved any further.
    if (bbs_with_uses.count(bb->id())) {
      break;
    }

    // If |bb| has one successor (succ_bb), and |bb| is the only predecessor
    // of succ_bb, then |inst| can be moved to succ_bb.  If succ_bb, has move
    // then one predecessor, then moving |inst| into succ_bb could cause it to
    // be executed more often, so the search has to stop.
    if (bb->terminator()->opcode() == spv::Op::OpBranch) {
      uint32_t succ_bb_id = bb->terminator()->GetSingleWordInOperand(0);
      if (cfg()->preds(succ_bb_id).size() == 1) {
        bb = context()->get_instr_block(succ_bb_id);
        continue;
      } else {
        break;
      }
    }

    // The remaining checks need to know the merge node.  If there is no merge
    // instruction or an OpLoopMerge, then it is a break or continue.  We could
    // figure it out, but not worth doing it now.
    Instruction* merge_inst = bb->GetMergeInst();
    if (merge_inst == nullptr ||
        merge_inst->opcode() != spv::Op::OpSelectionMerge) {
      break;
    }

    // Check all of the successors of |bb| it see which lead to a use of |inst|
    // before reaching the merge node.
    bool used_in_multiple_blocks = false;
    uint32_t bb_used_in = 0;
    bb->ForEachSuccessorLabel([this, bb, &bb_used_in, &used_in_multiple_blocks,
                               &bbs_with_uses](uint32_t* succ_bb_id) {
      if (IntersectsPath(*succ_bb_id, bb->MergeBlockIdIfAny(), bbs_with_uses)) {
        if (bb_used_in == 0) {
          bb_used_in = *succ_bb_id;
        } else {
          used_in_multiple_blocks = true;
        }
      }
    });

    // If more than one successor, which is not the merge block, uses |inst|
    // then we have to leave |inst| in bb because there is none of the
    // successors dominate all uses of |inst|.
    if (used_in_multiple_blocks) {
      break;
    }

    if (bb_used_in == 0) {
      // If |inst| is not used before reaching the merge node, then we can move
      // |inst| to the merge node.
      bb = context()->get_instr_block(bb->MergeBlockIdIfAny());
    } else {
      // If the only successor that leads to a used of |inst| has more than 1
      // predecessor, then moving |inst| could cause it to be executed more
      // often, so we cannot move it.
      if (cfg()->preds(bb_used_in).size() != 1) {
        break;
      }

      // If |inst| is used after the merge block, then |bb_used_in| does not
      // dominate all of the uses.  So we cannot move |inst| any further.
      if (IntersectsPath(bb->MergeBlockIdIfAny(), original_bb->id(),
                         bbs_with_uses)) {
        break;
      }

      // Otherwise, |bb_used_in| dominates all uses, so move |inst| into that
      // block.
      bb = context()->get_instr_block(bb_used_in);
    }
    continue;
  }
  return (bb != original_bb ? bb : nullptr);
}